

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlSplitQName(xmlParserCtxtPtr ctxt,xmlChar *name,xmlChar **prefix)

{
  long lVar1;
  byte bVar2;
  uint val;
  int iVar3;
  xmlChar *pxVar4;
  size_t __n;
  xmlChar *pxVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  int l;
  xmlChar buf [105];
  int local_ac;
  byte local_a8 [120];
  
  if ((prefix == (xmlChar **)0x0) || (*prefix = (xmlChar *)0x0, name == (xmlChar *)0x0)) {
    return (xmlChar *)0x0;
  }
  bVar2 = *name;
  if (bVar2 == 0x3a) {
LAB_00157350:
    pxVar4 = xmlStrdup(name);
    return pxVar4;
  }
  uVar8 = 0;
  while ((bVar2 != 0 && (bVar2 != 0x3a))) {
    if (uVar8 == 100) {
      __n = 100;
      goto LAB_001573d8;
    }
    local_a8[uVar8] = bVar2;
    lVar1 = uVar8 + 1;
    uVar8 = uVar8 + 1;
    bVar2 = name[lVar1];
  }
  if (uVar8 < 100) {
    pbVar9 = name + uVar8 + 1;
    uVar7 = 100;
    pxVar4 = (xmlChar *)0x0;
  }
  else {
    __n = uVar8 & 0xffffffff;
LAB_001573d8:
    uVar7 = (ulong)(uint)((int)__n * 2);
    pxVar4 = (xmlChar *)(*xmlMallocAtomic)(uVar7);
    if (pxVar4 == (xmlChar *)0x0) goto LAB_00157698;
    pbVar9 = name + uVar8;
    memcpy(pxVar4,local_a8,__n);
    while ((pbVar9 = pbVar9 + 1, bVar2 != 0 && (bVar2 != 0x3a))) {
      pxVar5 = pxVar4;
      if ((int)uVar7 < (int)__n + 10) {
        uVar7 = (ulong)(uint)((int)uVar7 * 2);
        pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,uVar7);
        if (pxVar5 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar4);
          goto LAB_00157698;
        }
      }
      pxVar5[__n] = bVar2;
      __n = __n + 1;
      pxVar4 = pxVar5;
      bVar2 = *pbVar9;
    }
    pxVar4[__n & 0xffffffff] = '\0';
    uVar8 = __n;
  }
  if ((bVar2 == 0x3a) && (*pbVar9 == 0)) {
    if (pxVar4 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar4);
    }
    *prefix = (xmlChar *)0x0;
    goto LAB_00157350;
  }
  uVar6 = 100;
  if (pxVar4 == (xmlChar *)0x0) {
    pxVar4 = xmlStrndup(local_a8,(int)uVar8);
    uVar6 = uVar7;
  }
  if (bVar2 != 0x3a) {
    return pxVar4;
  }
  bVar2 = *pbVar9;
  *prefix = pxVar4;
  if (bVar2 == 0) {
    pbVar9 = (byte *)0x1f258f;
    iVar3 = 0;
    goto LAB_0015760e;
  }
  if (((0x19 < (byte)((bVar2 & 0xdf) + 0xbf)) && (bVar2 != 0x3a)) && (bVar2 != 0x5f)) {
    val = xmlStringCurrentChar(ctxt,pbVar9,&local_ac);
    if ((int)val < 0x100) {
      if ((((0x16 < val - 0xc0) && ((0x19 < (val & 0xffffffdf) - 0x41 && (val != 0x5f)))) &&
          ((int)val < 0xf8)) && (0x1e < val - 0xd8)) {
LAB_001575c6:
        xmlFatalErrMsgStr(ctxt,XML_NS_ERR_QNAME,"Name %s is not XML Namespace compliant\n",name);
      }
    }
    else {
      iVar3 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if ((iVar3 == 0) &&
         ((val - 0x302a < 0xfffffff7 && val - 0x9fa6 < 0xffffae5a) && val != 0x3007))
      goto LAB_001575c6;
    }
  }
  pbVar9 = pbVar9 + 1;
  if ((int)uVar6 < 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      local_a8[uVar8] = bVar2;
      bVar2 = pbVar9[uVar8];
      uVar8 = uVar8 + 1;
      if (bVar2 == 0) break;
    } while (uVar8 < uVar6);
    if (uVar8 < uVar6) {
      pbVar9 = local_a8;
      iVar3 = (int)uVar8;
LAB_0015760e:
      pxVar4 = xmlStrndup(pbVar9,iVar3);
      return pxVar4;
    }
    pbVar9 = pbVar9 + uVar8;
  }
  uVar7 = (ulong)(uint)((int)uVar8 * 2);
  pxVar4 = (xmlChar *)(*xmlMallocAtomic)(uVar7);
  if (pxVar4 != (xmlChar *)0x0) {
    uVar8 = uVar8 & 0xffffffff;
    memcpy(pxVar4,local_a8,uVar8);
    pxVar5 = pxVar4;
    if (bVar2 != 0) {
      do {
        pxVar4 = pxVar5;
        if ((int)uVar7 < (int)uVar8 + 10) {
          uVar7 = (ulong)(uint)((int)uVar7 * 2);
          pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar5,uVar7);
          if (pxVar4 == (xmlChar *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar5);
            return (xmlChar *)0x0;
          }
        }
        pxVar4[uVar8] = bVar2;
        uVar8 = uVar8 + 1;
        bVar2 = *pbVar9;
        pbVar9 = pbVar9 + 1;
        pxVar5 = pxVar4;
      } while (bVar2 != 0);
      uVar8 = uVar8 & 0xffffffff;
    }
    pxVar4[uVar8] = '\0';
    return pxVar4;
  }
LAB_00157698:
  xmlErrMemory(ctxt,(char *)0x0);
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlSplitQName(xmlParserCtxtPtr ctxt, const xmlChar *name, xmlChar **prefix) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    xmlChar *buffer = NULL;
    int len = 0;
    int max = XML_MAX_NAMELEN;
    xmlChar *ret = NULL;
    const xmlChar *cur = name;
    int c;

    if (prefix == NULL) return(NULL);
    *prefix = NULL;

    if (cur == NULL) return(NULL);

#ifndef XML_XML_NAMESPACE
    /* xml: prefix is not really a namespace */
    if ((cur[0] == 'x') && (cur[1] == 'm') &&
        (cur[2] == 'l') && (cur[3] == ':'))
	return(xmlStrdup(name));
#endif

    /* nasty but well=formed */
    if (cur[0] == ':')
	return(xmlStrdup(name));

    c = *cur++;
    while ((c != 0) && (c != ':') && (len < max)) { /* tested bigname.xml */
	buf[len++] = c;
	c = *cur++;
    }
    if (len >= max) {
	/*
	 * Okay someone managed to make a huge name, so he's ready to pay
	 * for the processing speed.
	 */
	max = len * 2;

	buffer = (xmlChar *) xmlMallocAtomic(max);
	if (buffer == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	memcpy(buffer, buf, len);
	while ((c != 0) && (c != ':')) { /* tested bigname.xml */
	    if (len + 10 > max) {
	        xmlChar *tmp;

		max *= 2;
		tmp = (xmlChar *) xmlRealloc(buffer, max);
		if (tmp == NULL) {
		    xmlFree(buffer);
		    xmlErrMemory(ctxt, NULL);
		    return(NULL);
		}
		buffer = tmp;
	    }
	    buffer[len++] = c;
	    c = *cur++;
	}
	buffer[len] = 0;
    }

    if ((c == ':') && (*cur == 0)) {
        if (buffer != NULL)
	    xmlFree(buffer);
	*prefix = NULL;
	return(xmlStrdup(name));
    }

    if (buffer == NULL)
	ret = xmlStrndup(buf, len);
    else {
	ret = buffer;
	buffer = NULL;
	max = XML_MAX_NAMELEN;
    }


    if (c == ':') {
	c = *cur;
        *prefix = ret;
	if (c == 0) {
	    return(xmlStrndup(BAD_CAST "", 0));
	}
	len = 0;

	/*
	 * Check that the first character is proper to start
	 * a new name
	 */
	if (!(((c >= 0x61) && (c <= 0x7A)) ||
	      ((c >= 0x41) && (c <= 0x5A)) ||
	      (c == '_') || (c == ':'))) {
	    int l;
	    int first = CUR_SCHAR(cur, l);

	    if (!IS_LETTER(first) && (first != '_')) {
		xmlFatalErrMsgStr(ctxt, XML_NS_ERR_QNAME,
			    "Name %s is not XML Namespace compliant\n",
				  name);
	    }
	}
	cur++;

	while ((c != 0) && (len < max)) { /* tested bigname2.xml */
	    buf[len++] = c;
	    c = *cur++;
	}
	if (len >= max) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    max = len * 2;

	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
	        xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    memcpy(buffer, buf, len);
	    while (c != 0) { /* tested bigname2.xml */
		if (len + 10 > max) {
		    xmlChar *tmp;

		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buffer);
			return(NULL);
		    }
		    buffer = tmp;
		}
		buffer[len++] = c;
		c = *cur++;
	    }
	    buffer[len] = 0;
	}

	if (buffer == NULL)
	    ret = xmlStrndup(buf, len);
	else {
	    ret = buffer;
	}
    }

    return(ret);
}